

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall
SAT::analyze(SAT *this,int nodeid,
            set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  Lit *pLVar1;
  bool bVar2;
  int iVar3;
  uint64_t d1;
  ulong uVar4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  int i;
  int iVar5;
  undefined1 learnt;
  uint uVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar7;
  Clause *c;
  Lit local_4c;
  vec<Lit> local_48;
  Lit *pLVar8;
  
  psVar7 = (set<int,_std::less<int>,_std::allocator<int>_> *)(ulong)(uint)nodeid;
  this->avg_depth = ((double)(int)((this->trail).sz - 1) - this->avg_depth) * 0.01 + this->avg_depth
  ;
  checkConflict(this);
  varDecayActivity(this);
  claDecayActivity(this);
  getLearntClause(this,nodeid,contributingNogoods);
  explainUnlearnable(this,psVar7);
  if (so.exhaustive_activity == true) {
    explainToExhaustion(this,contributingNogoods);
  }
  clearSeen(this);
  iVar3 = findBackTrackLevel(this);
  this->back_jumps = this->back_jumps + (long)(int)(((this->trail).sz - iVar3) + -2);
  learnt = (undefined1)iVar3;
  btToLevel(this,iVar3);
  this->confl = (Clause *)0x0;
  if ((so.sort_learnt_level == true) && (uVar4 = (ulong)(this->out_learnt).sz, 3 < uVar4)) {
    pLVar1 = (this->out_learnt).data;
    pLVar8 = pLVar1 + uVar4;
    std::__sort<Lit*,__gnu_cxx::__ops::_Iter_comp_iter<SAT::LitSort>>
              (pLVar1 + 2,pLVar8,(_Iter_comp_iter<SAT::LitSort>)(this->lit_sort).level);
    learnt = SUB81(pLVar8,0);
  }
  r._pt = Clause_new<vec<Lit>>(&this->out_learnt,(bool)learnt);
  uVar6 = *(uint *)r._pt >> 8;
  (r._pt)->data[uVar6].x = (int)(float)this->cla_inc;
  ((Clause *)(r._a + 8))->data[(ulong)uVar6 - 1].x = 1;
  ((Lit *)(r._a + 0xc))[uVar6].x = nodeid;
  c = r._pt;
  learntLenBumpActivity(this,uVar6);
  if ((so.learn == true) && (0x1ff < *(uint *)r._pt)) {
    addClause(this,r._pt,so.one_watch);
  }
  if (((so.learn & 1U) == 0) || ((so.bin_clause_opt == true && (*(uint *)r._pt < 0x300)))) {
    vec<Clause_*>::push((this->rtrail).data + ((this->rtrail).sz - 1),&c);
    r._pt = c;
  }
  pLVar8 = (this->out_learnt).data;
  if (((so.bin_clause_opt & 1U) != 0) && (((ulong)*r._pt & 0xffffff00) == 0x200)) {
    r._pt = (Clause *)((long)pLVar8[1].x * 4 + 2);
  }
  enqueue(this,(Lit)pLVar8->x,(Reason)r);
  if (so.ldsbad == true) {
    local_48.sz = 0;
    local_48.cap = 0;
    local_48.data = (Lit *)0x0;
    pLVar8 = (this->out_learnt).data;
    vec<Lit>::push(&local_48,pLVar8);
    iVar3 = -1;
    for (iVar5 = 0; uVar6 = (this->trail).sz, iVar5 < (int)(uVar6 - 1); iVar5 = iVar5 + 1) {
      local_4c.x = ((this->trail).data[uVar6 + iVar3].data)->x ^ 1;
      pLVar8 = &local_4c;
      vec<Lit>::push(&local_48,&local_4c);
      iVar3 = iVar3 + -1;
    }
    c = Clause_new<vec<Lit>>(&local_48,SUB81(pLVar8,0));
    vec<Clause_*>::push((this->rtrail).data + ((this->rtrail).sz - 1),&c);
    free(local_48.data);
  }
  if (so.ldsb == true) {
    bVar2 = LDSB::processImpl(&ldsb,c);
    if (!bVar2) {
      engine.async_fail = true;
    }
  }
  if ((so.nof_learnts <= (int)(this->learnts).sz) ||
     ((long)(so.learnts_mlimit / 4) <= this->learnts_literals)) {
    reduceDB(this);
  }
  return;
}

Assistant:

void SAT::analyze(int nodeid, std::set<int>& contributingNogoods) {
	avg_depth += 0.01 * (decisionLevel() - avg_depth);

	/* if (so.debug) { */
	/*   std::cerr << "trail:\n"; */
	/*   for (int i = 0 ; i < trail.size() ; i++) { */
	/*     std::cerr << "level " << i << ":"; */
	/*     for (int j = 0 ; j < trail[i].size() ; j++) { */
	/*       Lit& lit = trail[i][j]; */
	/*       std::cerr << " " << getLitString(toInt(lit)); */
	/*     } */
	/*     std::cerr << "\n"; */
	/*   } */
	/* } */

	checkConflict();
	varDecayActivity();
	claDecayActivity();
	getLearntClause(nodeid, contributingNogoods);
	explainUnlearnable(contributingNogoods);
	if (so.exhaustive_activity) {
		explainToExhaustion(contributingNogoods);
	}
	clearSeen();

	const int btlevel = findBackTrackLevel();
	back_jumps += decisionLevel() - 1 - btlevel;
	//	fprintf(stderr, "btlevel = %d\n", btlevel);
	btToLevel(btlevel);
	confl = nullptr;

	if (so.sort_learnt_level && out_learnt.size() >= 4) {
		std::sort((Lit*)out_learnt + 2, (Lit*)out_learnt + out_learnt.size(), lit_sort);
	}

#if DEBUG_VERBOSE
	std::cerr << "out_learnt:";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << toInt(out_learnt[i]);
	}
	std::cerr << "\n";
	std::cerr << "out_learnt (interpreted):";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << litString[toInt(out_learnt[i])];
	}
	std::cerr << "\n";
#endif

	Clause* c = Clause_new(out_learnt, true);
	c->activity() = static_cast<float>(cla_inc);
	c->rawActivity() = 1;
	c->clauseID() = nodeid;

	learntLenBumpActivity(c->size());

	/* std::cerr << "conflict found clause of length " << c->size() << "\n"; */

	/* if (c->size() == 1) { */
	/*     std::cerr << "learntfact: " << getLitString(toInt((*c)[0])) << "\n"; */
	/* } */

	if (so.learn && c->size() >= 2) {
		addClause(*c, so.one_watch);
	}

	if (!so.learn || (so.bin_clause_opt && c->size() <= 2)) {
		rtrail.last().push(c);
	}

	enqueue(out_learnt[0], (so.bin_clause_opt && c->size() == 2) ? Reason(out_learnt[1]) : c);

	if (PRINT_ANALYSIS) {
		printClause(*c);
	}

	if (so.ldsbad) {
		vec<Lit> out_learnt2;
		out_learnt2.push(out_learnt[0]);
		for (int i = 0; i < decisionLevel(); i++) {
			out_learnt2.push(~decLit(decisionLevel() - i));
		}
		c = Clause_new(out_learnt2, true);
		rtrail.last().push(c);
	}

	if (so.ldsb && !ldsb.processImpl(c)) {
		engine.async_fail = true;
	}

	if (static_cast<int>(learnts.size()) >= so.nof_learnts ||
			learnts_literals >= so.learnts_mlimit / 4) {
		reduceDB();
	}
}